

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_qneg_s8_aarch64(CPUARMState_conflict *env,uint32_t x)

{
  return (char)(x >> 8) * 0xff00 & 0xffffU | -x & 0xff |
         (-(int)(char)(x >> 0x10) & 0xffU) << 0x10 | -(x & 0xff000000);
}

Assistant:

uint32_t HELPER(neon_qneg_s8)(CPUARMState *env, uint32_t x)
{
    neon_s8 vec;
    NEON_UNPACK(neon_s8, vec, x);
    DO_QNEG8(vec.v1);
    DO_QNEG8(vec.v2);
    DO_QNEG8(vec.v3);
    DO_QNEG8(vec.v4);
    NEON_PACK(neon_s8, x, vec);
    return x;
}